

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exhaustive-solver.hpp
# Opt level: O2

int __thiscall
baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,double>::operator()
          (exhaustive_solver<baryonyx::itm::maximize_tag,double> *this,int k,
          vector<rc,_std::allocator<rc>_> *reduced_cost,int r_size)

{
  undefined8 uVar1;
  int iVar2;
  pointer prVar3;
  uint uVar4;
  iterator iVar5;
  int *piVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  uint *puVar10;
  __normal_iterator<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_double>::item_*,_std::vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_double>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_double>::item>_>_>
  __i;
  long lVar11;
  long lVar12;
  ulong *puVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong __new_size;
  long lVar17;
  bool bVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [64];
  double z;
  undefined1 auVar23 [64];
  key_type local_44;
  
  local_44.bk_min = 0;
  local_44.bk_max = 0;
  local_44.k = k;
  iVar5 = std::
          _Rb_tree<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_double>::constraint,_baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_double>::constraint,_std::_Identity<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_double>::constraint>,_std::less<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_double>::constraint>,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_double>::constraint>_>
          ::find((_Rb_tree<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_double>::constraint,_baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_double>::constraint,_std::_Identity<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_double>::constraint>,_std::less<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_double>::constraint>,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_double>::constraint>_>
                  *)(this + 0x48),&local_44);
  if (iVar5._M_node == (_Base_ptr)(this + 0x50)) {
    details::fail_fast("Precondition","it_constraint != constraints.end()",
                       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/exhaustive-solver.hpp"
                       ,"189");
  }
  __new_size = (ulong)(uint)r_size;
  std::
  vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_double>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_double>::item>_>
  ::resize((vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_double>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_double>::item>_>
            *)this,__new_size);
  lVar15 = *(long *)this;
  piVar6 = &((reduced_cost->super__Vector_base<rc,_std::allocator<rc>_>)._M_impl.
             super__Vector_impl_data._M_start)->id;
  for (lVar11 = 0; __new_size * 0x18 - lVar11 != 0; lVar11 = lVar11 + 0x18) {
    *(double *)(lVar15 + lVar11) = ((rc *)(piVar6 + -2))->value;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = *(ulong *)piVar6;
    piVar6 = piVar6 + 4;
    auVar20 = vshufps_avx(auVar20,auVar20,0xe1);
    uVar1 = vmovlpd_avx(auVar20);
    *(undefined8 *)(lVar15 + 8 + lVar11) = uVar1;
    *(undefined4 *)(lVar15 + 0x10 + lVar11) = 0;
  }
  iVar2 = *(int *)&iVar5._M_node[1].field_0x4;
  lVar15 = *(long *)(this + 0x18);
  prVar3 = (reduced_cost->super__Vector_base<rc,_std::allocator<rc>_>)._M_impl.
           super__Vector_impl_data._M_start;
  auVar22 = ZEXT864(0) << 0x40;
  for (lVar11 = 0; __new_size * 4 - lVar11 != 0; lVar11 = lVar11 + 4) {
    if (*(int *)(lVar15 + (long)iVar2 * 4 + lVar11) != 0) {
      auVar22 = ZEXT864((ulong)(auVar22._0_8_ + *(double *)((long)&prVar3->value + lVar11 * 4)));
    }
  }
  uVar14 = 0;
  lVar11 = (long)iVar2 * 4 + (long)r_size * 4 + lVar15;
  for (uVar16 = 1; dVar19 = auVar22._0_8_, uVar16 != *(uint *)&iVar5._M_node[1]._M_parent;
      uVar16 = uVar16 + 1) {
    auVar23 = ZEXT864(0) << 0x40;
    for (lVar17 = 0; __new_size * 4 - lVar17 != 0; lVar17 = lVar17 + 4) {
      if (*(int *)(lVar11 + lVar17) != 0) {
        auVar23 = ZEXT864((ulong)(auVar23._0_8_ + *(double *)((long)&prVar3->value + lVar17 * 4)));
      }
    }
    auVar20 = vmaxsd_avx(auVar23._0_16_,auVar22._0_16_);
    auVar22 = ZEXT1664(auVar20);
    if (dVar19 < auVar23._0_8_) {
      uVar14 = uVar16 & 0xffffffff;
    }
    lVar11 = lVar11 + (long)r_size * 4;
  }
  puVar10 = (uint *)(*(long *)this + 0x10);
  for (uVar16 = 0; __new_size != uVar16; uVar16 = uVar16 + 1) {
    *puVar10 = (uint)(*(int *)(lVar15 + (long)((int)uVar14 * r_size + iVar2) * 4 + uVar16 * 4) != 0)
    ;
    puVar10 = puVar10 + 6;
  }
  lVar15 = *(long *)this;
  lVar11 = *(long *)(this + 8);
  if (lVar15 != lVar11) {
    std::operator()(lVar15,lVar11,(int)LZCOUNT((lVar11 - lVar15) / 0x18) * 2 ^ 0x7e);
    if (lVar11 - lVar15 < 0x181) {
      std::operator()(lVar15,lVar11);
    }
    else {
      lVar17 = lVar15 + 0x180;
      std::operator()(lVar15,lVar17);
      for (; lVar17 != lVar11; lVar17 = lVar17 + 0x18) {
        std::operator()(lVar17);
      }
    }
  }
  lVar11 = *(long *)(this + 8);
  lVar17 = *(long *)this;
  lVar12 = lVar11 - lVar17;
  lVar7 = lVar12 / 0x18;
  lVar15 = lVar17 + 0x30;
  for (lVar8 = lVar7 >> 2; 0 < lVar8; lVar8 = lVar8 + -1) {
    if (*(int *)(lVar15 + -0x20) == 0) {
      lVar9 = lVar15 + -0x30;
      goto LAB_00106fc7;
    }
    if (*(int *)(lVar15 + -8) == 0) {
      lVar9 = lVar15 + -0x18;
      goto LAB_00106fc7;
    }
    lVar9 = lVar15;
    if (*(int *)(lVar15 + 0x10) == 0) goto LAB_00106fc7;
    if (*(int *)(lVar15 + 0x28) == 0) {
      lVar9 = lVar15 + 0x18;
      goto LAB_00106fc7;
    }
    lVar15 = lVar15 + 0x60;
    lVar12 = lVar12 + -0x60;
  }
  lVar8 = lVar15 + -0x30;
  lVar12 = lVar12 / 0x18;
  if (lVar12 != 1) {
    if (lVar12 == 3) {
      lVar9 = lVar8;
      if (*(int *)(lVar15 + -0x20) == 0) goto LAB_00106fc7;
      lVar8 = lVar15 + -0x18;
    }
    else {
      lVar9 = lVar11;
      if (lVar12 != 2) goto LAB_00106fc7;
    }
    lVar9 = lVar8;
    if (*(int *)(lVar8 + 0x10) == 0) goto LAB_00106fc7;
    lVar8 = lVar8 + 0x18;
  }
  lVar9 = lVar8;
  if (*(int *)(lVar8 + 0x10) != 0) {
    lVar9 = lVar11;
  }
LAB_00106fc7:
  puVar13 = (ulong *)(lVar17 + 8);
  piVar6 = &((reduced_cost->super__Vector_base<rc,_std::allocator<rc>_>)._M_impl.
             super__Vector_impl_data._M_start)->id;
  while (bVar18 = lVar7 != 0, lVar7 = lVar7 + -1, bVar18) {
    ((rc *)(piVar6 + -2))->value = (double)puVar13[-1];
    auVar21._8_8_ = 0;
    auVar21._0_8_ = *puVar13;
    puVar13 = puVar13 + 3;
    auVar20 = vshufps_avx(auVar21,auVar21,0xe1);
    uVar1 = vmovlpd_avx(auVar20);
    *(undefined8 *)piVar6 = uVar1;
    piVar6 = piVar6 + 4;
  }
  if (lVar9 == lVar11) {
    uVar4 = -(uint)(*(int *)(lVar17 + 0x10) == 0) | r_size;
  }
  else {
    uVar4 = (int)((lVar9 - lVar17) / 0x18) - 1;
  }
  return uVar4;
}

Assistant:

int solve(int k, R& reduced_cost, int r_size)
    {
        const auto it_constraint = constraints.find(k);
        bx_expects(it_constraint != constraints.end());

        items.resize(r_size);
        for (int i = 0; i != r_size; ++i) {
            items[i].r = reduced_cost[i].value;
            items[i].variable = reduced_cost[i].id;
            items[i].factor = reduced_cost[i].f;
            items[i].result = 0;
        }

        Float z_best = 0;
        auto best = 0;
        auto start_solution = it_constraint->start;

        for (int j = 0; j != r_size; ++j)
            if (flat_constraints[start_solution + j])
                z_best += reduced_cost[j].value;

        for (auto i = 1; i != it_constraint->solutions; ++i) {
            start_solution = it_constraint->start + (i * r_size);

            Float z = 0;
            for (int j = 0; j != r_size; ++j)
                if (flat_constraints[start_solution + j])
                    z += reduced_cost[j].value;

            if (is_best_solution(z, z_best)) {
                z_best = z;
                best = i;
            }
        }

        start_solution = it_constraint->start + (best * r_size);
        for (int i = 0; i != r_size; ++i)
            items[i].result = flat_constraints[start_solution + i] ? 1 : 0;

        std::sort(std::begin(items),
                  std::end(items),
                  [](const auto& lhs, const auto& rhs) {
                      if (lhs.result == rhs.result) {
                          if constexpr (std::is_same_v<Mode, minimize_tag>)
                              return lhs.r < rhs.r;
                          else
                              return lhs.r > rhs.r;
                      } else
                          return lhs.result > rhs.result;
                  });

        auto middle =
          std::find_if(std::begin(items),
                       std::end(items),
                       [](const auto& item) { return item.result == 0; });

        for (std::size_t i = 0, e = items.size(); i != e; ++i) {
            reduced_cost[i].value = items[i].r;
            reduced_cost[i].id = items[i].variable;
            reduced_cost[i].f = items[i].factor;
        }

        if (middle == std::end(items))
            return items[0].result == 0 ? -1 : r_size;

        return static_cast<int>(std::distance(std::begin(items), middle) - 1);
    }